

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_version(void)

{
  char cfitsioversion [40];
  float version;
  char acStack_38 [52];
  float local_4;
  
  fp_msg((char *)0x1068a0);
  ffvers(&local_4);
  snprintf(acStack_38,0x28," CFITSIO version %5.3f",(double)local_4);
  fp_msg((char *)0x1068d2);
  fp_msg((char *)0x1068de);
  return 0;
}

Assistant:

int fp_version (void)
{
        float version;
        char cfitsioversion[40];

        fp_msg (FPACK_VERSION);
        fits_get_version(&version);
        snprintf(cfitsioversion, 40," CFITSIO version %5.3f", version);
        fp_msg(cfitsioversion);
        fp_msg ("\n");
        return(0);
}